

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  byte bVar1;
  int *piVar2;
  uchar uVar3;
  void *__src;
  long lVar4;
  size_t __n;
  byte bVar5;
  uchar *puVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uchar *puVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int local_d4;
  ulong uStack_d0;
  int zlen;
  ulong local_c8;
  int *local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  int *local_98;
  long local_90;
  ulong local_88;
  size_t local_80;
  long local_78;
  int local_70;
  int local_6c;
  uchar *local_68;
  uchar *local_60;
  long local_58;
  ulong local_50;
  uchar *local_48;
  int local_40;
  uint local_3c;
  uint local_38;
  int local_34;
  
  uVar18 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar18;
  }
  iVar19 = (uVar18 + 1) * y;
  local_98 = out_len;
  local_70 = x;
  local_3c = n;
  local_38 = y;
  local_48 = (uchar *)malloc((long)iVar19);
  if (local_48 != (uchar *)0x0) {
    local_80 = (size_t)(int)uVar18;
    local_6c = iVar19;
    local_50 = (ulong)uVar18;
    __src = malloc(local_80);
    if (__src == (void *)0x0) {
      free(local_48);
    }
    else {
      lVar4 = (long)(int)local_3c;
      local_78 = lVar4;
      if (0 < (int)local_38) {
        local_b0 = (long)stride_bytes;
        local_a8 = (long)(int)(uVar18 + 1);
        local_a0 = (ulong)local_38;
        uVar7 = (ulong)local_3c;
        local_b8 = local_50 & 0xffffffff;
        lVar21 = (long)pixels - local_b0;
        puVar12 = pixels + lVar4;
        puVar6 = pixels + (lVar4 - local_b0);
        local_58 = local_80 - lVar4;
        uVar15 = 0;
        uStack_d0 = uVar7;
        do {
          local_c0 = stbi_write_png_to_mem::mapping;
          if (uVar15 == 0) {
            local_c0 = stbi_write_png_to_mem::firstmap;
          }
          local_40 = 0x7fffffff;
          local_34 = 0;
          uVar14 = 0;
          do {
            iVar13 = (int)uVar14;
            iVar19 = local_34;
            if (iVar13 == 0) {
              iVar19 = 0;
            }
            if (iVar19 < 5) {
              lVar17 = (long)iVar19;
              do {
                local_90 = lVar17;
                iVar19 = local_c0[local_90];
                if (0 < (int)local_3c) {
                  uVar16 = 0;
                  do {
                    switch(iVar19) {
                    case 0:
                    case 1:
                    case 5:
                    case 6:
                      uVar3 = pixels[uVar16];
                      break;
                    case 2:
                    case 4:
                      uVar3 = pixels[uVar16] - *(char *)(lVar21 + uVar16);
                      break;
                    case 3:
                      uVar3 = pixels[uVar16] - (*(byte *)(lVar21 + uVar16) >> 1);
                      break;
                    default:
                      goto switchD_001080e8_default;
                    }
                    *(uchar *)((long)__src + uVar16) = uVar3;
switchD_001080e8_default:
                    uVar16 = uVar16 + 1;
                  } while (uVar7 != uVar16);
                }
                if ((int)local_3c < (int)local_50) {
                  lVar17 = 0;
                  do {
                    switch(iVar19) {
                    case 0:
                      uVar3 = puVar12[lVar17];
                      break;
                    case 1:
                    case 6:
                      uVar3 = puVar12[lVar17] - pixels[lVar17];
                      break;
                    case 2:
                      uVar3 = puVar12[lVar17] - puVar6[lVar17];
                      break;
                    case 3:
                      uVar3 = puVar12[lVar17] -
                              (char)((uint)puVar6[lVar17] + (uint)pixels[lVar17] >> 1);
                      break;
                    case 4:
                      bVar8 = pixels[lVar17];
                      bVar1 = puVar6[lVar17];
                      bVar5 = *(byte *)(lVar21 + lVar17);
                      iVar10 = ((uint)bVar1 + (uint)bVar8) - (uint)bVar5;
                      uVar9 = iVar10 - (uint)bVar8;
                      uVar18 = -uVar9;
                      if (0 < (int)uVar9) {
                        uVar18 = uVar9;
                      }
                      uVar20 = iVar10 - (uint)bVar1;
                      uVar9 = -uVar20;
                      if (0 < (int)uVar20) {
                        uVar9 = uVar20;
                      }
                      uVar11 = iVar10 - (uint)bVar5;
                      uVar20 = -uVar11;
                      if (0 < (int)uVar11) {
                        uVar20 = uVar11;
                      }
                      if (uVar9 <= uVar20) {
                        bVar5 = bVar1;
                      }
                      if (uVar20 < uVar18) {
                        bVar8 = bVar5;
                      }
                      if (uVar9 < uVar18) {
                        bVar8 = bVar5;
                      }
                      uVar3 = puVar12[lVar17] - bVar8;
                      uVar7 = uStack_d0;
                      break;
                    case 5:
                      uVar3 = puVar12[lVar17] - (pixels[lVar17] >> 1);
                      break;
                    default:
                      goto switchD_00108142_default;
                    }
                    *(uchar *)((long)__src + lVar17 + lVar4) = uVar3;
switchD_00108142_default:
                    lVar17 = lVar17 + 1;
                  } while (local_58 != lVar17);
                }
                if (iVar13 == 0) {
                  if ((int)local_50 < 1) {
                    iVar19 = 0;
                  }
                  else {
                    uVar16 = 0;
                    iVar19 = 0;
                    do {
                      bVar8 = (char)*(byte *)((long)__src + uVar16) >> 7;
                      iVar19 = iVar19 + (uint)(byte)((*(byte *)((long)__src + uVar16) ^ bVar8) -
                                                    bVar8);
                      uVar16 = uVar16 + 1;
                    } while (local_b8 != uVar16);
                  }
                  if (iVar19 < local_40) {
                    local_34 = (int)local_90;
                    local_40 = iVar19;
                  }
                }
                local_c8 = uVar14;
              } while ((iVar13 == 0) && (lVar17 = local_90 + 1, local_90 < 4));
            }
            uVar14 = (ulong)(iVar13 + 1);
          } while (iVar13 == 0);
          local_48[uVar15 * local_a8] = (uchar)local_34;
          local_88 = uVar15;
          local_68 = puVar12;
          local_60 = puVar6;
          memcpy(local_48 + uVar15 * local_a8 + 1,__src,local_80);
          uVar15 = local_88 + 1;
          lVar21 = lVar21 + local_b0;
          pixels = pixels + local_b0;
          puVar12 = local_68 + local_b0;
          puVar6 = local_60 + local_b0;
        } while (uVar15 != local_a0);
      }
      free(__src);
      puVar12 = local_48;
      puVar6 = stbi_zlib_compress(local_48,local_6c,&local_d4,8);
      free(puVar12);
      __n = (size_t)local_d4;
      puVar12 = (uchar *)malloc(__n + 0x39);
      piVar2 = local_98;
      if (puVar12 != (uchar *)0x0) {
        *local_98 = (int)(__n + 0x39);
        puVar12[0] = 0x89;
        puVar12[1] = 'P';
        puVar12[2] = 'N';
        puVar12[3] = 'G';
        puVar12[4] = '\r';
        puVar12[5] = '\n';
        puVar12[6] = '\x1a';
        puVar12[7] = '\n';
        puVar12[8] = '\0';
        puVar12[9] = '\0';
        puVar12[10] = '\0';
        puVar12[0xb] = '\r';
        puVar12[0xc] = 'I';
        puVar12[0xd] = 'H';
        puVar12[0xe] = 'D';
        puVar12[0xf] = 'R';
        puVar12[0x10] = (uchar)((uint)local_70 >> 0x18);
        puVar12[0x11] = (uchar)((uint)local_70 >> 0x10);
        puVar12[0x12] = (uchar)((uint)local_70 >> 8);
        puVar12[0x13] = (uchar)local_70;
        puVar12[0x14] = (uchar)(local_38 >> 0x18);
        puVar12[0x15] = (uchar)(local_38 >> 0x10);
        puVar12[0x16] = (uchar)(local_38 >> 8);
        puVar12[0x17] = (uchar)local_38;
        puVar12[0x18] = '\b';
        puVar12[0x19] = (&DAT_00112160)[local_78 * 4];
        puVar12[0x1a] = '\0';
        puVar12[0x1b] = '\0';
        puVar12[0x1c] = '\0';
        uVar18 = stbiw__crc32(puVar12 + 0xc,0x11);
        puVar12[0x1d] = (uchar)(uVar18 >> 0x18);
        puVar12[0x1e] = (uchar)(uVar18 >> 0x10);
        puVar12[0x1f] = (uchar)(uVar18 >> 8);
        puVar12[0x20] = (uchar)uVar18;
        puVar12[0x21] = (uchar)((uint)local_d4 >> 0x18);
        puVar12[0x22] = (uchar)((uint)local_d4 >> 0x10);
        puVar12[0x23] = (uchar)((uint)local_d4 >> 8);
        puVar12[0x24] = (uchar)local_d4;
        puVar12[0x25] = 'I';
        puVar12[0x26] = 'D';
        puVar12[0x27] = 'A';
        puVar12[0x28] = 'T';
        memmove(puVar12 + 0x29,puVar6,__n);
        free(puVar6);
        uVar18 = stbiw__crc32(puVar12 + 0x25,local_d4 + 4);
        puVar12[__n + 0x29] = (uchar)(uVar18 >> 0x18);
        puVar12[__n + 0x2a] = (uchar)(uVar18 >> 0x10);
        puVar12[__n + 0x2b] = (uchar)(uVar18 >> 8);
        puVar12[__n + 0x2c] = (uchar)uVar18;
        puVar6 = puVar12 + __n + 0x2d;
        puVar6[0] = '\0';
        puVar6[1] = '\0';
        puVar6[2] = '\0';
        puVar6[3] = '\0';
        puVar6[4] = 'I';
        puVar6[5] = 'E';
        puVar6[6] = 'N';
        puVar6[7] = 'D';
        uVar18 = stbiw__crc32(puVar12 + __n + 0x31,4);
        *(uint *)(puVar12 + __n + 0x35) =
             uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
        if (puVar12 + __n + 0x39 == puVar12 + *piVar2) {
          return puVar12;
        }
        __assert_fail("o == out + *out_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image_write.h"
                      ,0x2b3,
                      "unsigned char *stbi_write_png_to_mem(unsigned char *, int, int, int, int, int *)"
                     );
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *stbi_write_png_to_mem(unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int i,j,k,p,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      static int mapping[] = { 0,1,2,3,4 };
      static int firstmap[] = { 0,1,0,5,6 };
      int *mymap = j ? mapping : firstmap;
      int best = 0, bestval = 0x7fffffff;
      for (p=0; p < 2; ++p) {
         for (k= p?best:0; k < 5; ++k) {
            int type = mymap[k],est=0;
            unsigned char *z = pixels + stride_bytes*j;
            for (i=0; i < n; ++i)
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - (z[i-stride_bytes]>>1); break;
                  case 4: line_buffer[i] = (signed char) (z[i] - stbiw__paeth(0,z[i-stride_bytes],0)); break;
                  case 5: line_buffer[i] = z[i]; break;
                  case 6: line_buffer[i] = z[i]; break;
               }
            for (i=n; i < x*n; ++i) {
               switch (type) {
                  case 0: line_buffer[i] = z[i]; break;
                  case 1: line_buffer[i] = z[i] - z[i-n]; break;
                  case 2: line_buffer[i] = z[i] - z[i-stride_bytes]; break;
                  case 3: line_buffer[i] = z[i] - ((z[i-n] + z[i-stride_bytes])>>1); break;
                  case 4: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], z[i-stride_bytes], z[i-stride_bytes-n]); break;
                  case 5: line_buffer[i] = z[i] - (z[i-n]>>1); break;
                  case 6: line_buffer[i] = z[i] - stbiw__paeth(z[i-n], 0,0); break;
               }
            }
            if (p) break;
            for (i=0; i < x*n; ++i)
               est += abs((signed char) line_buffer[i]);
            if (est < bestval) { bestval = est; best = k; }
         }
      }
      // when we get here, best contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) best;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, 8); // increase 8 to get smaller but use more memory
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = (unsigned char) ctype[n];
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}